

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc_internal_inlines_a.h
# Opt level: O0

void pre_reentrancy(tsd_t *tsd,arena_t *arena)

{
  char *in_RDI;
  _Bool fast;
  uint8_t state;
  _Bool fast_1;
  undefined7 in_stack_ffffffffffffffc0;
  
  in_RDI[3] = in_RDI[3] + '\x01';
  if (*in_RDI == '\0') {
    tsd_slow_update((tsd_t *)CONCAT17(*in_RDI,in_stack_ffffffffffffffc0));
  }
  return;
}

Assistant:

static inline void
pre_reentrancy(tsd_t *tsd, arena_t *arena) {
	/* arena is the current context.  Reentry from a0 is not allowed. */
	assert(arena != arena_get(tsd_tsdn(tsd), 0, false));

	bool fast = tsd_fast(tsd);
	assert(tsd_reentrancy_level_get(tsd) < INT8_MAX);
	++*tsd_reentrancy_levelp_get(tsd);
	if (fast) {
		/* Prepare slow path for reentrancy. */
		tsd_slow_update(tsd);
		assert(tsd_state_get(tsd) == tsd_state_nominal_slow);
	}
}